

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[11],std::__cxx11::string,char[11],char_const*,char[32],std::__cxx11::string,char[26]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [11],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1,
          char (*Args_2) [11],char **Args_3,char (*Args_4) [32],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_5,
          char (*Args_6) [26])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[11],std::__cxx11::string,char[11],char_const*,char[32],std::__cxx11::string,char[26]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [11])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
             (char (*) [11])Args_1,(char **)Args_2,(char (*) [32])Args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_4,
             (char (*) [26])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}